

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O2

size_t __thiscall Diligent::RenderPassCache::RenderPassCacheKey::GetHash(RenderPassCacheKey *this)

{
  size_t sVar1;
  Uint32 rt;
  ulong uVar2;
  TEXTURE_FORMAT *Val;
  
  if (this->Hash != 0) {
    return this->Hash;
  }
  sVar1 = ComputeHash<unsigned_char,unsigned_char,Diligent::TEXTURE_FORMAT,bool,bool>
                    (&this->NumRenderTargets,&this->SampleCount,&this->DSVFormat,&this->EnableVRS,
                     &this->ReadOnlyDSV);
  this->Hash = sVar1;
  Val = this->RTVFormats;
  for (uVar2 = 0; uVar2 < this->NumRenderTargets; uVar2 = uVar2 + 1) {
    HashCombine<Diligent::TEXTURE_FORMAT>(&this->Hash,Val);
    Val = Val + 1;
  }
  return this->Hash;
}

Assistant:

size_t GetHash() const noexcept
        {
            if (Hash == 0)
            {
                Hash = ComputeHash(NumRenderTargets, SampleCount, DSVFormat, EnableVRS, ReadOnlyDSV);
                for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                    HashCombine(Hash, RTVFormats[rt]);
            }
            return Hash;
        }